

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_push_type(CPDecl *decl,CTypeID id)

{
  byte *pbVar1;
  CTypeID1 CVar2;
  CType *pCVar3;
  CPDeclIdx CVar4;
  uint size;
  CTInfo info;
  uint info_00;
  
  pCVar3 = decl->cp->cts->tab;
  info_00 = pCVar3[id].info;
  size = pCVar3[id].size;
  switch(info_00 >> 0x1c) {
  case 1:
  case 5:
    CVar4 = cp_add(decl,id + 0x70000000,0);
    decl->pos = CVar4;
    size = decl->attr & 0x3000000;
    if (size == 0) {
      return;
    }
    info = 0x80010000;
    goto LAB_0013b9d0;
  default:
    info = decl->attr & 0x3000000 | info_00;
LAB_0013b9d0:
    CVar4 = cp_add(decl,info,size);
    decl->pos = CVar4;
    pbVar1 = (byte *)((long)&decl->attr + 3);
    *pbVar1 = *pbVar1 & 0xfc;
    break;
  case 3:
    if ((info_00 & 0xc000000) != 0) {
      info_00 = info_00 | decl->attr & 0x3000000;
      decl->attr = decl->attr & 0xfcffffff;
    }
    cp_push_type(decl,info_00 & 0xffff);
    CVar4 = cp_add(decl,info_00 & 0xffff0000,size);
    decl->pos = CVar4;
    decl->stack[CVar4].sib = 1;
    break;
  case 6:
    CVar2 = pCVar3[id].sib;
    CVar4 = cp_add(decl,info_00,size);
    decl->pos = CVar4;
    decl->stack[CVar4].sib = CVar2;
    break;
  case 8:
    if ((info_00 & 0xf0ff0000) == 0x80010000) {
      decl->attr = decl->attr & ~size;
    }
    cp_push_type(decl,info_00 & 0xffff);
    CVar4 = cp_add(decl,info_00 & 0xffff0000,size);
    decl->pos = CVar4;
  }
  return;
}

Assistant:

static void cp_push_type(CPDecl *decl, CTypeID id)
{
  CType *ct = ctype_get(decl->cp->cts, id);
  CTInfo info = ct->info;
  CTSize size = ct->size;
  switch (ctype_type(info)) {
  case CT_STRUCT: case CT_ENUM:
    cp_push(decl, CTINFO(CT_TYPEDEF, id), 0);  /* Don't copy unique types. */
    if ((decl->attr & CTF_QUAL)) {  /* Push unmerged qualifiers. */
      cp_push(decl, CTINFO(CT_ATTRIB, CTATTRIB(CTA_QUAL)),
	      (decl->attr & CTF_QUAL));
      decl->attr &= ~CTF_QUAL;
    }
    break;
  case CT_ATTRIB:
    if (ctype_isxattrib(info, CTA_QUAL))
      decl->attr &= ~size;  /* Remove redundant qualifiers. */
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    break;
  case CT_ARRAY:
    if ((ct->info & (CTF_VECTOR|CTF_COMPLEX))) {
      info |= (decl->attr & CTF_QUAL);
      decl->attr &= ~CTF_QUAL;
    }
    cp_push_type(decl, ctype_cid(info));  /* Unroll. */
    cp_push(decl, info & ~CTMASK_CID, size);  /* Copy type. */
    decl->stack[decl->pos].sib = 1;  /* Mark as already checked and sized. */
    /* Note: this is not copied to the ct->sib in the C type table. */
    break;
  case CT_FUNC:
    /* Copy type, link parameters (shared). */
    decl->stack[cp_push(decl, info, size)].sib = ct->sib;
    break;
  default:
    /* Copy type, merge common qualifiers. */
    cp_push(decl, info|(decl->attr & CTF_QUAL), size);
    decl->attr &= ~CTF_QUAL;
    break;
  }
}